

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Shape.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Shape_Shape(X3DImporter *this)

{
  FIReader *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement *this_00;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  uint uVar5;
  string *psVar6;
  allocator<char> local_99;
  string an;
  CX3DImporter_NodeElement *ne;
  string def;
  string use;
  
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  uVar5 = 0;
  ne = (CX3DImporter_NodeElement *)0x0;
  use.field_2._M_local_buf[0] = '\0';
  def.field_2._M_local_buf[0] = '\0';
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)uVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar4),&local_99);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)uVar5);
      psVar6 = &def;
LAB_004e3e94:
      std::__cxx11::string::assign((char *)psVar6);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)uVar5);
        psVar6 = &use;
        goto LAB_004e3e94;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (((!bVar2) && (bVar2 = std::operator==(&an,"bboxSize"), !bVar2)) &&
         (bVar2 = std::operator==(&an,"containerField"), !bVar2)) {
        Throw_IncorrectAttr(this,&an);
      }
    }
    std::__cxx11::string::~string((string *)&an);
  }
  if (use._M_string_length == 0) {
    this_00 = (CX3DImporter_NodeElement *)operator_new(0x50);
    CX3DImporter_NodeElement_Shape::CX3DImporter_NodeElement_Shape
              ((CX3DImporter_NodeElement_Shape *)this_00,this->NodeElement_Cur);
    ne = this_00;
    if (def._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this_00->ID);
    }
    iVar4 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar4 == '\0') {
      ParseHelper_Node_Enter(this,ne);
      do {
        do {
          while( true ) {
            iVar4 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar4 == '\0') {
              std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Shape",&local_99);
              Throw_CloseNotFound(this,&an);
              std::__cxx11::string::~string((string *)&an);
              goto LAB_004e4640;
            }
            iVar4 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar4 != 1) break;
            std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Appearance",&local_99)
            ;
            bVar2 = XML_CheckNode_NameEqual(this,&an);
            std::__cxx11::string::~string((string *)&an);
            if (bVar2) {
              ParseNode_Shape_Appearance(this);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Arc2D",&local_99);
              bVar2 = XML_CheckNode_NameEqual(this,&an);
              std::__cxx11::string::~string((string *)&an);
              if (bVar2) {
                ParseNode_Geometry2D_Arc2D(this);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&an,"ArcClose2D",&local_99);
                bVar2 = XML_CheckNode_NameEqual(this,&an);
                std::__cxx11::string::~string((string *)&an);
                if (bVar2) {
                  ParseNode_Geometry2D_ArcClose2D(this);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&an,"Circle2D",&local_99);
                  bVar2 = XML_CheckNode_NameEqual(this,&an);
                  std::__cxx11::string::~string((string *)&an);
                  if (bVar2) {
                    ParseNode_Geometry2D_Circle2D(this);
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&an,"Disk2D",&local_99);
                    bVar2 = XML_CheckNode_NameEqual(this,&an);
                    std::__cxx11::string::~string((string *)&an);
                    if (bVar2) {
                      ParseNode_Geometry2D_Disk2D(this);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&an,"Polyline2D",&local_99);
                      bVar2 = XML_CheckNode_NameEqual(this,&an);
                      std::__cxx11::string::~string((string *)&an);
                      if (bVar2) {
                        ParseNode_Geometry2D_Polyline2D(this);
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&an,"Polypoint2D",&local_99);
                        bVar2 = XML_CheckNode_NameEqual(this,&an);
                        std::__cxx11::string::~string((string *)&an);
                        if (bVar2) {
                          ParseNode_Geometry2D_Polypoint2D(this);
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&an,"Rectangle2D",&local_99);
                          bVar2 = XML_CheckNode_NameEqual(this,&an);
                          std::__cxx11::string::~string((string *)&an);
                          if (bVar2) {
                            ParseNode_Geometry2D_Rectangle2D(this);
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&an,"TriangleSet2D",&local_99);
                            bVar2 = XML_CheckNode_NameEqual(this,&an);
                            std::__cxx11::string::~string((string *)&an);
                            if (bVar2) {
                              ParseNode_Geometry2D_TriangleSet2D(this);
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&an,"Box",&local_99);
                              bVar2 = XML_CheckNode_NameEqual(this,&an);
                              std::__cxx11::string::~string((string *)&an);
                              if (bVar2) {
                                ParseNode_Geometry3D_Box(this);
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&an,"Cone",&local_99);
                                bVar2 = XML_CheckNode_NameEqual(this,&an);
                                std::__cxx11::string::~string((string *)&an);
                                if (bVar2) {
                                  ParseNode_Geometry3D_Cone(this);
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&an,"Cylinder",&local_99);
                                  bVar2 = XML_CheckNode_NameEqual(this,&an);
                                  std::__cxx11::string::~string((string *)&an);
                                  if (bVar2) {
                                    ParseNode_Geometry3D_Cylinder(this);
                                  }
                                  else {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&an,"ElevationGrid",&local_99);
                                    bVar2 = XML_CheckNode_NameEqual(this,&an);
                                    std::__cxx11::string::~string((string *)&an);
                                    if (bVar2) {
                                      ParseNode_Geometry3D_ElevationGrid(this);
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&an,"Extrusion",&local_99);
                                      bVar2 = XML_CheckNode_NameEqual(this,&an);
                                      std::__cxx11::string::~string((string *)&an);
                                      if (bVar2) {
                                        ParseNode_Geometry3D_Extrusion(this);
                                      }
                                      else {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&an,"IndexedFaceSet",&local_99);
                                        bVar2 = XML_CheckNode_NameEqual(this,&an);
                                        std::__cxx11::string::~string((string *)&an);
                                        if (bVar2) {
                                          ParseNode_Geometry3D_IndexedFaceSet(this);
                                        }
                                        else {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&an,"Sphere",&local_99);
                                          bVar2 = XML_CheckNode_NameEqual(this,&an);
                                          std::__cxx11::string::~string((string *)&an);
                                          if (bVar2) {
                                            ParseNode_Geometry3D_Sphere(this);
                                          }
                                          else {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&an,"IndexedLineSet",&local_99);
                                            bVar2 = XML_CheckNode_NameEqual(this,&an);
                                            std::__cxx11::string::~string((string *)&an);
                                            if (bVar2) {
                                              ParseNode_Rendering_IndexedLineSet(this);
                                            }
                                            else {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&an,"LineSet",&local_99);
                                              bVar2 = XML_CheckNode_NameEqual(this,&an);
                                              std::__cxx11::string::~string((string *)&an);
                                              if (bVar2) {
                                                ParseNode_Rendering_LineSet(this);
                                              }
                                              else {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&an,"PointSet",&local_99);
                                                bVar2 = XML_CheckNode_NameEqual(this,&an);
                                                std::__cxx11::string::~string((string *)&an);
                                                if (bVar2) {
                                                  ParseNode_Rendering_PointSet(this);
                                                }
                                                else {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&an,"IndexedTriangleFanSet",
                                                             &local_99);
                                                  bVar2 = XML_CheckNode_NameEqual(this,&an);
                                                  std::__cxx11::string::~string((string *)&an);
                                                  if (bVar2) {
                                                    ParseNode_Rendering_IndexedTriangleFanSet(this);
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&an,"IndexedTriangleSet",
                                                               &local_99);
                                                    bVar2 = XML_CheckNode_NameEqual(this,&an);
                                                    std::__cxx11::string::~string((string *)&an);
                                                    if (bVar2) {
                                                      ParseNode_Rendering_IndexedTriangleSet(this);
                                                    }
                                                    else {
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&an,
                                                                 "IndexedTriangleStripSet",&local_99
                                                                );
                                                      bVar2 = XML_CheckNode_NameEqual(this,&an);
                                                      std::__cxx11::string::~string((string *)&an);
                                                      if (bVar2) {
                                                        ParseNode_Rendering_IndexedTriangleStripSet
                                                                  (this);
                                                      }
                                                      else {
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  ((string *)&an,"TriangleFanSet",
                                                                   &local_99);
                                                        bVar2 = XML_CheckNode_NameEqual(this,&an);
                                                        std::__cxx11::string::~string((string *)&an)
                                                        ;
                                                        if (bVar2) {
                                                          ParseNode_Rendering_TriangleFanSet(this);
                                                        }
                                                        else {
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    ((string *)&an,"TriangleSet",
                                                                     &local_99);
                                                          bVar2 = XML_CheckNode_NameEqual(this,&an);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&an);
                                                          if (bVar2) {
                                                            ParseNode_Rendering_TriangleSet(this);
                                                          }
                                                          else {
                                                            std::__cxx11::string::
                                                            string<std::allocator<char>>
                                                                      ((string *)&an,
                                                                       "TriangleStripSet",&local_99)
                                                            ;
                                                            bVar2 = XML_CheckNode_NameEqual
                                                                              (this,&an);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&an);
                                                            if (bVar2) {
                                                              ParseNode_Rendering_TriangleStripSet
                                                                        (this);
                                                            }
                                                            else {
                                                              bVar2 = 
                                                  ParseHelper_CheckRead_X3DMetadataObject(this);
                                                  if (!bVar2) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&an,"Shape",&local_99);
                                                    XML_CheckNode_SkipUnsupported(this,&an);
                                                    std::__cxx11::string::~string((string *)&an);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar4 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar4 != 2);
        std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Shape",&local_99);
        bVar2 = XML_CheckNode_NameEqual(this,&an);
        std::__cxx11::string::~string((string *)&an);
      } while (!bVar2);
LAB_004e4640:
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,&ne);
    }
    this_01 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (def._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,&use,ENET_Shape,&ne);
    if (!bVar2) {
      Throw_USE_NotFound(this,&use);
    }
    this_01 = &this->NodeElement_Cur->Child;
  }
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
  push_back(this_01,&ne);
  std::__cxx11::string::~string((string *)&def);
  std::__cxx11::string::~string((string *)&use);
  return;
}

Assistant:

void X3DImporter::ParseNode_Shape_Shape()
{
    std::string use, def;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Shape, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Shape(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("Shape");
				// check for appearance node
				if(XML_CheckNode_NameEqual("Appearance")) { ParseNode_Shape_Appearance(); continue; }
				// check for X3DGeometryNodes
				if(XML_CheckNode_NameEqual("Arc2D")) { ParseNode_Geometry2D_Arc2D(); continue; }
				if(XML_CheckNode_NameEqual("ArcClose2D")) { ParseNode_Geometry2D_ArcClose2D(); continue; }
				if(XML_CheckNode_NameEqual("Circle2D")) { ParseNode_Geometry2D_Circle2D(); continue; }
				if(XML_CheckNode_NameEqual("Disk2D")) { ParseNode_Geometry2D_Disk2D(); continue; }
				if(XML_CheckNode_NameEqual("Polyline2D")) { ParseNode_Geometry2D_Polyline2D(); continue; }
				if(XML_CheckNode_NameEqual("Polypoint2D")) { ParseNode_Geometry2D_Polypoint2D(); continue; }
				if(XML_CheckNode_NameEqual("Rectangle2D")) { ParseNode_Geometry2D_Rectangle2D(); continue; }
				if(XML_CheckNode_NameEqual("TriangleSet2D")) { ParseNode_Geometry2D_TriangleSet2D(); continue; }
				if(XML_CheckNode_NameEqual("Box")) { ParseNode_Geometry3D_Box(); continue; }
				if(XML_CheckNode_NameEqual("Cone")) { ParseNode_Geometry3D_Cone(); continue; }
				if(XML_CheckNode_NameEqual("Cylinder")) { ParseNode_Geometry3D_Cylinder(); continue; }
				if(XML_CheckNode_NameEqual("ElevationGrid")) { ParseNode_Geometry3D_ElevationGrid(); continue; }
				if(XML_CheckNode_NameEqual("Extrusion")) { ParseNode_Geometry3D_Extrusion(); continue; }
				if(XML_CheckNode_NameEqual("IndexedFaceSet")) { ParseNode_Geometry3D_IndexedFaceSet(); continue; }
				if(XML_CheckNode_NameEqual("Sphere")) { ParseNode_Geometry3D_Sphere(); continue; }
				if(XML_CheckNode_NameEqual("IndexedLineSet")) { ParseNode_Rendering_IndexedLineSet(); continue; }
				if(XML_CheckNode_NameEqual("LineSet")) { ParseNode_Rendering_LineSet(); continue; }
				if(XML_CheckNode_NameEqual("PointSet")) { ParseNode_Rendering_PointSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleFanSet")) { ParseNode_Rendering_IndexedTriangleFanSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleSet")) { ParseNode_Rendering_IndexedTriangleSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleStripSet")) { ParseNode_Rendering_IndexedTriangleStripSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleFanSet")) { ParseNode_Rendering_TriangleFanSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleSet")) { ParseNode_Rendering_TriangleSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleStripSet")) { ParseNode_Rendering_TriangleStripSet(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("Shape");

			MACRO_NODECHECK_LOOPEND("Shape");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}